

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O1

OPENSSL_STACK * OPENSSL_sk_dup(OPENSSL_STACK *sk)

{
  OPENSSL_STACK *orig_ptr;
  void **ppvVar1;
  
  if ((sk != (OPENSSL_STACK *)0x0) &&
     (orig_ptr = (OPENSSL_STACK *)OPENSSL_zalloc(0x28), orig_ptr != (OPENSSL_STACK *)0x0)) {
    ppvVar1 = (void **)OPENSSL_memdup(sk->data,sk->num_alloc << 3);
    orig_ptr->data = ppvVar1;
    if (ppvVar1 != (void **)0x0) {
      orig_ptr->num = sk->num;
      orig_ptr->sorted = sk->sorted;
      orig_ptr->num_alloc = sk->num_alloc;
      orig_ptr->comp = sk->comp;
      return orig_ptr;
    }
    OPENSSL_free((void *)0x0);
    OPENSSL_free(orig_ptr);
  }
  return (OPENSSL_STACK *)0x0;
}

Assistant:

OPENSSL_STACK *OPENSSL_sk_dup(const OPENSSL_STACK *sk) {
  if (sk == NULL) {
    return NULL;
  }

  OPENSSL_STACK *ret =
      reinterpret_cast<OPENSSL_STACK *>(OPENSSL_zalloc(sizeof(OPENSSL_STACK)));
  if (ret == NULL) {
    return NULL;
  }

  ret->data = reinterpret_cast<void **>(
      OPENSSL_memdup(sk->data, sizeof(void *) * sk->num_alloc));
  if (ret->data == NULL) {
    goto err;
  }

  ret->num = sk->num;
  ret->sorted = sk->sorted;
  ret->num_alloc = sk->num_alloc;
  ret->comp = sk->comp;
  return ret;

err:
  OPENSSL_sk_free(ret);
  return NULL;
}